

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

bool Js::TypedArrayBase::TryGetLengthForOptimizedTypedArray
               (Var var,uint32 *lengthRef,TypeId *typeIdRef)

{
  TypeId typeId;
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  TypedArrayBase *pTVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x927,"(var)","var");
    if (!bVar2) goto LAB_00bfa864;
    *puVar4 = 0;
  }
  if (lengthRef == (uint32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x928,"(lengthRef)","lengthRef");
    if (!bVar2) goto LAB_00bfa864;
    *puVar4 = 0;
  }
  if (typeIdRef == (TypeId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x929,"(typeIdRef)","typeIdRef");
    if (!bVar2) goto LAB_00bfa864;
    *puVar4 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(var);
  if (bVar2) {
    pRVar5 = VarTo<Js::RecyclableObject>(var);
    typeId = ((pRVar5->type).ptr)->typeId;
    if (typeId - TypeIds_Int8Array < 9) {
      VVar3 = ValueType::FromTypeId(typeId,false);
      uStack_38._0_6_ = CONCAT24(VVar3.field_0,(undefined4)uStack_38);
      bVar2 = ValueType::IsOptimizedTypedArray((ValueType *)((long)&uStack_38 + 4));
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                    ,0x93c,
                                    "(ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray())",
                                    "ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray()");
        if (!bVar2) goto LAB_00bfa864;
        *puVar4 = 0;
      }
      pTVar6 = VarTo<Js::TypedArrayBase>(var);
      *lengthRef = (pTVar6->super_ArrayBufferParent).super_ArrayObject.length;
      *typeIdRef = typeId;
      return true;
    }
    VVar3 = ValueType::FromTypeId(typeId,false);
    uStack_38 = CONCAT26(VVar3.field_0,(undefined6)uStack_38);
    bVar2 = ValueType::IsOptimizedTypedArray((ValueType *)((long)&uStack_38 + 6));
    if (!bVar2) {
      return false;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x942,
                                "(!ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray())",
                                "!ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray()");
    if (!bVar2) {
LAB_00bfa864:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return false;
}

Assistant:

bool TypedArrayBase::TryGetLengthForOptimizedTypedArray(const Var var, uint32 *const lengthRef, TypeId *const typeIdRef)
    {
        Assert(var);
        Assert(lengthRef);
        Assert(typeIdRef);

        if(!VarIs<RecyclableObject>(var))
        {
            return false;
        }

        const TypeId typeId = VarTo<RecyclableObject>(var)->GetTypeId();
        switch(typeId)
        {
            case TypeIds_Int8Array:
            case TypeIds_Uint8Array:
            case TypeIds_Uint8ClampedArray:
            case TypeIds_Int16Array:
            case TypeIds_Uint16Array:
            case TypeIds_Int32Array:
            case TypeIds_Uint32Array:
            case TypeIds_Float32Array:
            case TypeIds_Float64Array:
                Assert(ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray());
                *lengthRef = VarTo<TypedArrayBase>(var)->GetLength();
                *typeIdRef = typeId;
                return true;
        }

        Assert(!ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray());
        return false;
    }